

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

bool __thiscall
c4::yml::Parser::_filter_nl<false,false>
          (Parser *this,substr r,size_t *i,size_t *pos,size_t indentation)

{
  anon_unknown_0 aVar1;
  char *pcVar2;
  pfn_error p_Var3;
  code *pcVar4;
  Location LVar5;
  Location LVar6;
  bool bVar7;
  undefined1 uVar8;
  size_t sVar9;
  size_t sVar10;
  char *pcVar11;
  anon_unknown_0 *this_00;
  size_t *indentation_00;
  csubstr r_00;
  ro_substr chars;
  size_t ii;
  undefined5 uStack_c0;
  undefined3 uStack_bb;
  undefined5 local_b8;
  undefined3 uStack_b3;
  undefined5 uStack_b0;
  undefined3 uStack_ab;
  undefined4 local_a8;
  pfn_error local_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  csubstr cStack_78;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  csubstr cStack_50;
  substr r_local;
  
  pcVar11 = (char *)r.len;
  this_00 = (anon_unknown_0 *)r.str;
  pcVar2 = (char *)*i;
  r_local.str = (char *)this_00;
  r_local.len = (size_t)pcVar11;
  if (pcVar11 <= pcVar2) {
    if (((byte)s_error_flags & 1) != 0) {
      bVar7 = is_debugger_attached();
      if (bVar7) {
        pcVar4 = (code *)swi(3);
        uVar8 = (*pcVar4)();
        return (bool)uVar8;
      }
    }
    handle_error(0x1e6196,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                 ,0x14c3,"i >= 0 && i < len");
  }
  aVar1 = this_00[(long)pcVar2];
  indentation_00 = pos;
  if (indentation == 0xffffffffffffffff) {
    local_b8 = 0x746e65646e;
    uStack_b3 = 0x697461;
    uStack_b0 = 0x3d21206e6f;
    uStack_ab = 0x706e20;
    ii._0_1_ = 'c';
    ii._1_1_ = 'h';
    ii._2_1_ = 'e';
    ii._3_1_ = 'c';
    ii._4_1_ = 'k';
    ii._5_1_ = ' ';
    ii._6_1_ = 'f';
    ii._7_1_ = 'a';
    uStack_c0 = 0x3a64656c69;
    uStack_bb = 0x692820;
    local_a8 = 0x29736f;
    if (((byte)s_error_flags & 1) != 0) {
      bVar7 = is_debugger_attached();
      if (bVar7) {
        pcVar4 = (code *)swi(3);
        uVar8 = (*pcVar4)();
        return (bool)uVar8;
      }
    }
    local_98 = (this->m_stack).m_callbacks.m_error;
    local_68 = 0;
    uStack_60 = 0x7bae;
    local_58 = 0;
    cStack_50 = to_csubstr(
                          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                          );
    LVar5.super_LineCol.line = uStack_60;
    LVar5.super_LineCol.offset = local_68;
    LVar5.super_LineCol.col = local_58;
    LVar5.name.str = cStack_50.str;
    LVar5.name.len = cStack_50.len;
    (*local_98)((char *)&ii,0x24,LVar5,(this->m_stack).m_callbacks.m_user_data);
  }
  if (aVar1 != (anon_unknown_0)0xa) {
    local_b8 = 0x3d20727275;
    uStack_b3 = 0x27203d;
    uStack_b0 = 0x29276e5c;
    ii._0_1_ = 'c';
    ii._1_1_ = 'h';
    ii._2_1_ = 'e';
    ii._3_1_ = 'c';
    ii._4_1_ = 'k';
    ii._5_1_ = ' ';
    ii._6_1_ = 'f';
    ii._7_1_ = 'a';
    uStack_c0 = 0x3a64656c69;
    uStack_bb = 0x632820;
    if (((byte)s_error_flags & 1) != 0) {
      bVar7 = is_debugger_attached();
      if (bVar7) {
        pcVar4 = (code *)swi(3);
        uVar8 = (*pcVar4)();
        return (bool)uVar8;
      }
    }
    p_Var3 = (this->m_stack).m_callbacks.m_error;
    local_90 = 0;
    uStack_88 = 0x7baf;
    local_80 = 0;
    cStack_78 = to_csubstr(
                          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                          );
    LVar6.super_LineCol.line = uStack_88;
    LVar6.super_LineCol.offset = local_90;
    LVar6.super_LineCol.col = local_80;
    LVar6.name.str = cStack_78.str;
    LVar6.name.len = cStack_78.len;
    (*p_Var3)((char *)&ii,0x1d,LVar6,(this->m_stack).m_callbacks.m_user_data);
  }
  r_00.len = (size_t)&ii;
  r_00.str = pcVar11;
  ii = (size_t)pcVar2;
  sVar9 = anon_unknown_0::count_following_newlines
                    (this_00,r_00,(size_t *)indentation,(size_t)indentation_00);
  if (sVar9 == 0) {
    chars.len = 2;
    chars.str = " \t";
    sVar9 = basic_substring<char>::first_not_of(&r_local,chars,(size_t)(pcVar2 + 1));
    if (sVar9 != 0xffffffffffffffff) {
      pcVar2 = (this->m_filter_arena).str;
      sVar9 = *pos;
      *pos = sVar9 + 1;
      pcVar2[sVar9] = ' ';
      bVar7 = true;
      goto LAB_001d859b;
    }
  }
  else {
    sVar10 = *pos;
    while (bVar7 = sVar9 != 0, sVar9 = sVar9 - 1, bVar7) {
      (this->m_filter_arena).str[sVar10] = '\n';
      sVar10 = sVar10 + 1;
    }
    *pos = sVar10;
  }
  bVar7 = false;
LAB_001d859b:
  *i = ii - 1;
  return bVar7;
}

Assistant:

bool Parser::_filter_nl(substr r, size_t *C4_RESTRICT i, size_t *C4_RESTRICT pos, size_t indentation)
{
    // a debugging scaffold:
    #if 0
    #define _c4dbgfnl(fmt, ...) _c4dbgpf("filter_nl[{}]: " fmt, *i, __VA_ARGS__)
    #else
    #define _c4dbgfnl(...)
    #endif

    const char curr = r[*i];
    bool replaced = false;

    _RYML_CB_ASSERT(m_stack.m_callbacks, indentation != npos);
    _RYML_CB_ASSERT(m_stack.m_callbacks, curr == '\n');

    _c4dbgfnl("found newline. sofar=[{}]~~~{}~~~", *pos, m_filter_arena.first(*pos));
    size_t ii = *i;
    size_t numnl_following = count_following_newlines(r, &ii, indentation);
    if(numnl_following)
    {
        _c4dbgfnl("{} consecutive (empty) lines {} in the middle. totalws={}", 1+numnl_following, ii < r.len ? "in the middle" : "at the end", ii - *i);
        for(size_t j = 0; j < numnl_following; ++j)
            m_filter_arena.str[(*pos)++] = '\n';
    }
    else
    {
        if(r.first_not_of(" \t", *i+1) != npos)
        {
            m_filter_arena.str[(*pos)++] = ' ';
            _c4dbgfnl("single newline. convert to space. ii={}/{}. sofar=[{}]~~~{}~~~", ii, r.len, *pos, m_filter_arena.first(*pos));
            replaced = true;
        }
        else
        {
            if C4_IF_CONSTEXPR (keep_trailing_whitespace)
            {
                m_filter_arena.str[(*pos)++] = ' ';
                _c4dbgfnl("single newline. convert to space. ii={}/{}. sofar=[{}]~~~{}~~~", ii, r.len, *pos, m_filter_arena.first(*pos));
                replaced = true;
            }
            else
            {
                _c4dbgfnl("last newline, everything else is whitespace. ii={}/{}", ii, r.len);
                *i = r.len;
            }
        }
        if C4_IF_CONSTEXPR (backslash_is_escape)
        {
            if(ii < r.len && r.str[ii] == '\\')
            {
                const char next = ii+1 < r.len ? r.str[ii+1] : '\0';
                if(next == ' ' || next == '\t')
                {
                    _c4dbgfnl("extend skip to backslash{}", "");
                    ++ii;
                }
            }
        }
    }
    *i = ii - 1; // correct for the loop increment

    #undef _c4dbgfnl

    return replaced;
}